

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O0

peer_request __thiscall
libtorrent::file_storage::map_file
          (file_storage *this,file_index_t file_index,int64_t file_offset,int size)

{
  peer_request pVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_4c [2];
  int local_44;
  long local_40;
  int64_t offset;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_30;
  int local_2c;
  int64_t iStack_28;
  int size_local;
  int64_t file_offset_local;
  file_storage *this_local;
  file_index_t file_index_local;
  peer_request ret;
  
  local_2c = size;
  iStack_28 = file_offset;
  file_offset_local = (int64_t)this;
  this_local._0_4_ = file_index.m_val;
  memset((void *)((long)&this_local + 4),0,0xc);
  local_30.m_val = (int)end_file(this);
  bVar3 = libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                    ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)&this_local,
                     &local_30);
  lVar7 = iStack_28;
  if (bVar3) {
    this_local._4_4_ = end_piece(this);
    file_index_local.m_val = 0;
    ret.piece.m_val = 0;
  }
  else {
    local_44 = this_local._0_4_;
    iVar5 = file_storage::file_offset(this,this_local._0_4_);
    local_40 = lVar7 + iVar5;
    iVar6 = total_size(this);
    lVar2 = local_40;
    if (lVar7 + iVar5 < iVar6) {
      iVar4 = piece_length(this);
      libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                (local_4c,(int)(lVar2 / (long)iVar4));
      lVar7 = local_40;
      this_local._4_4_ = local_4c[0].m_val;
      iVar4 = piece_length(this);
      file_index_local.m_val = (int)(lVar7 % (long)iVar4);
      ret.piece.m_val = local_2c;
      lVar7 = local_40 + local_2c;
      iVar5 = total_size(this);
      if (iVar5 < lVar7) {
        iVar5 = total_size(this);
        ret.piece.m_val = (int)iVar5 - (int)local_40;
      }
    }
    else {
      this_local._4_4_ = end_piece(this);
      file_index_local.m_val = 0;
      ret.piece.m_val = 0;
    }
  }
  pVar1.start = file_index_local.m_val;
  pVar1.piece.m_val = this_local._4_4_;
  pVar1.length = ret.piece.m_val;
  return pVar1;
}

Assistant:

peer_request file_storage::map_file(file_index_t const file_index
		, std::int64_t const file_offset, int const size) const
	{
		TORRENT_ASSERT_PRECOND(file_index < end_file());
		TORRENT_ASSERT(m_num_pieces >= 0);

		peer_request ret{};
		if (file_index >= end_file())
		{
			ret.piece = end_piece();
			ret.start = 0;
			ret.length = 0;
			return ret;
		}

		std::int64_t const offset = file_offset + this->file_offset(file_index);

		if (offset >= total_size())
		{
			ret.piece = end_piece();
			ret.start = 0;
			ret.length = 0;
		}
		else
		{
			ret.piece = piece_index_t(int(offset / piece_length()));
			ret.start = int(offset % piece_length());
			ret.length = size;
			if (offset + size > total_size())
				ret.length = int(total_size() - offset);
		}
		return ret;
	}